

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void sendError(UA_SecureChannel *channel,UA_ByteString *msg,size_t offset,UA_DataType *responseType,
              UA_UInt32 requestId,UA_StatusCode error)

{
  ushort uVar1;
  long lVar2;
  UA_StatusCode UVar3;
  UA_DateTime UVar4;
  UA_DateTime *__s;
  UA_DateTime UStack_b0;
  UA_DateTime local_a8;
  UA_RequestHeader requestHeader;
  size_t offset_local;
  
  UStack_b0 = 0x1272dd;
  requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)offset;
  UVar3 = UA_decodeBinary(msg,(size_t *)((long)&requestHeader.additionalHeader.content + 0x20),
                          &local_a8,UA_TYPES + 0x1d);
  if (UVar3 == 0) {
    uVar1 = responseType->memSize;
    lVar2 = -(ulong)(uVar1 + 0xf & 0xfffffff0);
    __s = (UA_DateTime *)((long)&local_a8 + lVar2);
    *(undefined8 *)((long)&UStack_b0 + lVar2) = 0x127300;
    memset(__s,0,(ulong)uVar1);
    *(undefined4 *)((long)&requestHeader + lVar2) = (undefined4)requestHeader.timestamp;
    *(undefined8 *)((long)&UStack_b0 + lVar2) = 0x127313;
    UVar4 = UA_DateTime_now();
    *__s = UVar4;
    *(UA_StatusCode *)((long)&requestHeader + lVar2 + 4) = error;
    *(undefined8 *)((long)&UStack_b0 + lVar2) = 0x12732c;
    UA_SecureChannel_sendBinaryMessage(channel,requestId,__s,responseType);
    *(undefined8 *)((long)&UStack_b0 + lVar2) = 0x12733f;
    UA_deleteMembers(&local_a8,UA_TYPES + 0x1d);
    *(undefined8 *)((long)&UStack_b0 + lVar2) = 0x12734e;
    UA_deleteMembers(__s,UA_TYPES + 0x47);
  }
  return;
}

Assistant:

static void
sendError(UA_SecureChannel *channel, const UA_ByteString *msg,
          size_t offset, const UA_DataType *responseType,
          UA_UInt32 requestId, UA_StatusCode error) {
    UA_RequestHeader requestHeader;
    UA_StatusCode retval = UA_RequestHeader_decodeBinary(msg, &offset, &requestHeader);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_ResponseHeader *responseHeader = (UA_ResponseHeader*)response;
    responseHeader->requestHandle = requestHeader.requestHandle;
    responseHeader->timestamp = UA_DateTime_now();
    responseHeader->serviceResult = error;
    UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);
    UA_RequestHeader_deleteMembers(&requestHeader);
    UA_ResponseHeader_deleteMembers(responseHeader);
}